

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmGraph.cpp
# Opt level: O3

void PrintUsers(InstructionVMGraphContext *ctx,VmValue *value,bool fullNames)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (ctx->showUsers != true) {
    return;
  }
  Print(ctx,"[");
  if (value->hasSideEffects == true) {
    Print(ctx,"self");
  }
  uVar1 = (value->users).count;
  uVar2 = (ulong)uVar1;
  if (uVar1 != 0) {
    uVar3 = 0;
    do {
      uVar1 = (uint)uVar2;
      if ((uVar3 != 0) || (value->hasSideEffects != false)) {
        Print(ctx,", ");
        uVar1 = (value->users).count;
      }
      if (uVar1 <= uVar3) {
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x199,
                      "T &SmallArray<VmValue *, 8>::operator[](unsigned int) [T = VmValue *, N = 8]"
                     );
      }
      PrintName(ctx,(value->users).data[uVar3],fullNames,true);
      uVar3 = uVar3 + 1;
      uVar2 = (ulong)(value->users).count;
    } while (uVar3 < uVar2);
  }
  Print(ctx,"] ");
  return;
}

Assistant:

void PrintUsers(InstructionVMGraphContext &ctx, VmValue *value, bool fullNames)
{
	if(!ctx.showUsers)
		return;

	Print(ctx, "[");

	if(value->hasSideEffects)
		Print(ctx, "self");

	for(unsigned i = 0; i < value->users.size(); i++)
	{
		if(value->hasSideEffects || i != 0)
			Print(ctx, ", ");

		PrintName(ctx, value->users[i], fullNames, true);
	}

	Print(ctx, "] ");
}